

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

double xmlXPathCastNodeSetToNumber(xmlNodeSetPtr ns)

{
  xmlChar *str;
  double dVar1;
  
  if (ns != (xmlNodeSetPtr)0x0) {
    str = xmlXPathCastNodeSetToString(ns);
    dVar1 = xmlXPathStringEvalNumber(str);
    (*xmlFree)(str);
    return dVar1;
  }
  return xmlXPathNAN;
}

Assistant:

double
xmlXPathCastNodeSetToNumber (xmlNodeSetPtr ns) {
    xmlChar *str;
    double ret;

    if (ns == NULL)
	return(xmlXPathNAN);
    str = xmlXPathCastNodeSetToString(ns);
    ret = xmlXPathCastStringToNumber(str);
    xmlFree(str);
    return(ret);
}